

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::layout_for_variable_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRVariable *var)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  string *this_00;
  bool bVar4;
  bool bVar5;
  ExecutionModel EVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  StorageClass SVar9;
  SPIRType *pSVar10;
  Bitset *this_01;
  mapped_type *pmVar11;
  ulong uVar12;
  char *pcVar13;
  CompilerError *pCVar14;
  byte bVar15;
  byte bVar16;
  undefined8 in_RCX;
  Bitset *pBVar18;
  undefined8 uVar19;
  uint32_t index;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  ID *__k;
  byte bVar23;
  uint32_t local_1f4;
  Bitset combined_decoration;
  uint32_t xfb_buffer;
  uint local_1ac;
  SPIRType *local_1a8;
  uint local_19c;
  uint32_t xfb_stride;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_190;
  string *local_158;
  Bitset *local_150;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  attr;
  uint *puVar17;
  
  bVar4 = is_legacy(this);
  if ((bVar4) ||
     (bVar4 = subpass_input_is_framebuffer_fetch(this,(var->super_IVariant).self.id), bVar4)) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&attr);
    return __return_storage_ptr__;
  }
  attr.
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&attr.stack_storage;
  attr.
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .buffer_size = 0;
  attr.buffer_capacity = 8;
  local_158 = __return_storage_ptr__;
  pSVar10 = Compiler::get<spirv_cross::SPIRType>
                      (&this->super_Compiler,*(uint32_t *)&(var->super_IVariant).field_0xc);
  this_01 = Compiler::get_decoration_bitset(&this->super_Compiler,(ID)(var->super_IVariant).self.id)
  ;
  local_1a8 = pSVar10;
  local_150 = Compiler::get_decoration_bitset
                        (&this->super_Compiler,(ID)(pSVar10->super_IVariant).self.id);
  bVar4 = Bitset::get(this_01,0x1482);
  if (bVar4) {
    ::std::__cxx11::string::string
              ((string *)&combined_decoration,"passthrough",(allocator *)&xfb_stride);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&attr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &combined_decoration);
    ::std::__cxx11::string::~string((string *)&combined_decoration);
  }
  bVar15 = var->storage == StorageClassPushConstant & (this->options).vulkan_semantics;
  puVar17 = (uint *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar15);
  if (bVar15 == 1) {
    ::std::__cxx11::string::string
              ((string *)&combined_decoration,"push_constant",(allocator *)&xfb_stride);
LAB_00253465:
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&attr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &combined_decoration);
    ::std::__cxx11::string::~string((string *)&combined_decoration);
  }
  else if (var->storage == StorageClassShaderRecordBufferKHR) {
    pcVar13 = "shaderRecordNV";
    if (this->ray_tracing_is_khr != false) {
      pcVar13 = "shaderRecordEXT";
    }
    ::std::__cxx11::string::string((string *)&combined_decoration,pcVar13,(allocator *)&xfb_stride);
    goto LAB_00253465;
  }
  uVar12 = this_01->lower;
  if ((uVar12 & 0x10) != 0) {
    ::std::__cxx11::string::string
              ((string *)&combined_decoration,"row_major",(allocator *)&xfb_stride);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&attr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &combined_decoration);
    ::std::__cxx11::string::~string((string *)&combined_decoration);
    uVar12 = this_01->lower;
  }
  if ((uVar12 & 0x20) != 0) {
    ::std::__cxx11::string::string
              ((string *)&combined_decoration,"column_major",(allocator *)&xfb_stride);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&attr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &combined_decoration);
    ::std::__cxx11::string::~string((string *)&combined_decoration);
  }
  if (((this->options).vulkan_semantics == true) && ((this_01->lower & 0x80000000000) != 0)) {
    xfb_stride = Compiler::get_decoration
                           (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                            DecorationInputAttachmentIndex);
    join<char_const(&)[26],unsigned_int>
              ((string *)&combined_decoration,(spirv_cross *)"input_attachment_index = ",
               (char (*) [26])&xfb_stride,puVar17);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&attr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &combined_decoration);
    ::std::__cxx11::string::~string((string *)&combined_decoration);
  }
  __k = &(pSVar10->super_IVariant).self;
  bVar4 = Compiler::has_decoration(&this->super_Compiler,(ID)__k->id,DecorationBlock);
  local_19c = (uint)bVar4;
  if (((this_01->lower & 0x40000000) != 0) &&
     (bVar5 = can_use_io_location(this,var->storage,bVar4), bVar5)) {
    combined_decoration.lower = 0;
    combined_decoration.higher._M_h._M_buckets = &combined_decoration.higher._M_h._M_single_bucket;
    combined_decoration.higher._M_h._M_bucket_count = 1;
    combined_decoration.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    combined_decoration.higher._M_h._M_element_count = 0;
    combined_decoration.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    combined_decoration.higher._M_h._M_rehash_policy._M_next_resize = 0;
    combined_decoration.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
    puVar17 = (uint *)0x0;
    while( true ) {
      pmVar11 = ::std::__detail::
                _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&(this->super_Compiler).ir.meta,__k);
      if ((uint *)(pmVar11->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size <=
          puVar17) break;
      Compiler::combined_decoration_for_member
                ((Bitset *)&xfb_stride,&this->super_Compiler,local_1a8,(uint32_t)puVar17);
      Bitset::merge_or(&combined_decoration,(Bitset *)&xfb_stride);
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_190);
      puVar17 = (uint *)(ulong)((uint32_t)puVar17 + 1);
    }
    if ((combined_decoration.lower & 0x40000000) == 0) {
      xfb_buffer = Compiler::get_decoration
                             (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                              DecorationLocation);
      join<char_const(&)[12],unsigned_int>
                ((string *)&xfb_stride,(spirv_cross *)"location = ",(char (*) [12])&xfb_buffer,
                 puVar17);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&attr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &xfb_stride);
      ::std::__cxx11::string::~string((string *)&xfb_stride);
    }
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&combined_decoration.higher._M_h);
  }
  EVar6 = Compiler::get_execution_model(&this->super_Compiler);
  SVar9 = var->storage;
  if (SVar9 == StorageClassOutput && EVar6 == ExecutionModelFragment) {
    uVar7 = Compiler::get_decoration
                      (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationLocation);
    bVar5 = location_is_non_coherent_framebuffer_fetch(this,uVar7);
    if (bVar5) {
      ::std::__cxx11::string::string
                ((string *)&combined_decoration,"noncoherent",(allocator *)&xfb_stride);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&attr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &combined_decoration);
      ::std::__cxx11::string::~string((string *)&combined_decoration);
    }
    SVar9 = var->storage;
  }
  pBVar18 = (Bitset *)(ulong)SVar9;
  if (bVar4 && SVar9 == StorageClassOutput) {
    sVar3 = (local_1a8->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
            .buffer_size;
    xfb_stride = 0;
    xfb_buffer = 0;
    uVar12 = this_01->lower;
    pBVar18 = (Bitset *)~uVar12;
    uVar7 = 0;
    bVar4 = ((ulong)pBVar18 & 0x3000000000) == 0;
    if (bVar4) {
      xfb_buffer = Compiler::get_decoration
                             (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                              DecorationXfbBuffer);
      xfb_stride = Compiler::get_decoration
                             (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                              DecorationXfbStride);
      uVar12 = this_01->lower;
    }
    local_1ac = 0;
    if (((uint)uVar12 >> 0x1d & 1) != 0) {
      uVar7 = Compiler::get_decoration
                        (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationStream);
      local_1ac = (uint)CONCAT71((uint7)(uint3)(uVar7 >> 8),1);
    }
    bVar15 = 0;
    for (index = 0; (uint32_t)sVar3 != index; index = index + 1) {
      bVar5 = Compiler::has_member_decoration
                        (&this->super_Compiler,(TypeID)__k->id,index,DecorationStream);
      if (bVar5) {
        uVar19 = 0;
        uVar8 = Compiler::get_member_decoration
                          (&this->super_Compiler,(TypeID)__k->id,index,DecorationStream);
        if ((local_1ac & 1) == 0) {
          local_1ac = (uint)CONCAT71((uint7)(uint3)(uVar8 >> 8),1);
          uVar7 = uVar8;
        }
        else {
          local_1ac = (uint)CONCAT71((int7)((ulong)uVar19 >> 8),1);
          bVar5 = uVar8 != uVar7;
          uVar7 = uVar8;
          if (bVar5) {
            pCVar14 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&combined_decoration,"IO block member Stream mismatch.",
                       (allocator *)&local_1f4);
            CompilerError::CompilerError(pCVar14,(string *)&combined_decoration);
            __cxa_throw(pCVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
        }
      }
      pBVar18 = (Bitset *)0x23;
      bVar5 = Compiler::has_member_decoration
                        (&this->super_Compiler,(TypeID)__k->id,index,DecorationOffset);
      if (bVar5) {
        bVar5 = Compiler::has_member_decoration
                          (&this->super_Compiler,(TypeID)__k->id,index,DecorationXfbBuffer);
        if (bVar5) {
          uVar8 = Compiler::get_member_decoration
                            (&this->super_Compiler,(TypeID)__k->id,index,DecorationXfbBuffer);
          if ((bVar4) && (uVar8 != xfb_buffer)) {
            pCVar14 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&combined_decoration,"IO block member XfbBuffer mismatch.",
                       (allocator *)&local_1f4);
            CompilerError::CompilerError(pCVar14,(string *)&combined_decoration);
            __cxa_throw(pCVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          bVar4 = true;
          xfb_buffer = uVar8;
        }
        pBVar18 = (Bitset *)0x25;
        bVar5 = Compiler::has_member_decoration
                          (&this->super_Compiler,(TypeID)__k->id,index,DecorationXfbStride);
        bVar15 = 1;
        if (bVar5) {
          pBVar18 = (Bitset *)0x25;
          uVar8 = Compiler::get_member_decoration
                            (&this->super_Compiler,(TypeID)__k->id,index,DecorationXfbStride);
          if ((bVar4) && (uVar8 != xfb_stride)) {
            pCVar14 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&combined_decoration,"IO block member XfbStride mismatch.",
                       (allocator *)&local_1f4);
            CompilerError::CompilerError(pCVar14,(string *)&combined_decoration);
            __cxa_throw(pCVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          bVar15 = 1;
          bVar4 = true;
          xfb_stride = uVar8;
        }
      }
    }
    bVar4 = (bool)(bVar4 & bVar15);
    if (bVar4) {
      join<char_const(&)[14],unsigned_int&>
                ((string *)&combined_decoration,(spirv_cross *)"xfb_buffer = ",
                 (char (*) [14])&xfb_buffer,(uint *)pBVar18);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&attr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &combined_decoration);
      ::std::__cxx11::string::~string((string *)&combined_decoration);
      join<char_const(&)[14],unsigned_int&>
                ((string *)&combined_decoration,(spirv_cross *)0x397a7d,(char (*) [14])&xfb_stride,
                 (uint *)pBVar18);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&attr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &combined_decoration);
      ::std::__cxx11::string::~string((string *)&combined_decoration);
    }
    if ((local_1ac & 1) != 0) {
      EVar6 = Compiler::get_execution_model(&this->super_Compiler);
      if (EVar6 != ExecutionModelGeometry) {
        pCVar14 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&combined_decoration,
                   "Geometry streams can only be used in geometry shaders.",(allocator *)&local_1f4)
        ;
        CompilerError::CompilerError(pCVar14,(string *)&combined_decoration);
        __cxa_throw(pCVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((this->options).es == true) {
        pCVar14 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&combined_decoration,"Multiple geometry streams not supported in ESSL."
                   ,(allocator *)&local_1f4);
        CompilerError::CompilerError(pCVar14,(string *)&combined_decoration);
        __cxa_throw(pCVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((this->options).version < 400) {
        ::std::__cxx11::string::string
                  ((string *)&combined_decoration,"GL_ARB_transform_feedback3",
                   (allocator *)&local_1f4);
        require_extension_internal(this,(string *)&combined_decoration);
        ::std::__cxx11::string::~string((string *)&combined_decoration);
      }
      local_1f4 = Compiler::get_decoration
                            (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                             DecorationStream);
      join<char_const(&)[10],unsigned_int>
                ((string *)&combined_decoration,(spirv_cross *)"stream = ",(char (*) [10])&local_1f4
                 ,(uint *)pBVar18);
LAB_00253b79:
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&attr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &combined_decoration);
      ::std::__cxx11::string::~string((string *)&combined_decoration);
    }
  }
  else if (SVar9 == StorageClassOutput) {
    uVar12 = this_01->lower;
    pBVar18 = (Bitset *)0x3800000000;
    bVar4 = (uVar12 & 0x3800000000) == 0x3800000000;
    if (bVar4) {
      xfb_stride = Compiler::get_decoration
                             (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                              DecorationXfbBuffer);
      join<char_const(&)[14],unsigned_int>
                ((string *)&combined_decoration,(spirv_cross *)"xfb_buffer = ",
                 (char (*) [14])&xfb_stride,(uint *)pBVar18);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&attr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &combined_decoration);
      ::std::__cxx11::string::~string((string *)&combined_decoration);
      xfb_stride = Compiler::get_decoration
                             (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                              DecorationXfbStride);
      join<char_const(&)[14],unsigned_int>
                ((string *)&combined_decoration,(spirv_cross *)0x397a7d,(char (*) [14])&xfb_stride,
                 (uint *)pBVar18);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&attr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &combined_decoration);
      ::std::__cxx11::string::~string((string *)&combined_decoration);
      xfb_stride = Compiler::get_decoration
                             (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                              DecorationOffset);
      join<char_const(&)[14],unsigned_int>
                ((string *)&combined_decoration,(spirv_cross *)0x397ae1,(char (*) [14])&xfb_stride,
                 (uint *)pBVar18);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&attr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &combined_decoration);
      ::std::__cxx11::string::~string((string *)&combined_decoration);
      uVar12 = this_01->lower;
    }
    if (((uint)uVar12 >> 0x1d & 1) != 0) {
      EVar6 = Compiler::get_execution_model(&this->super_Compiler);
      if (EVar6 != ExecutionModelGeometry) {
        pCVar14 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&combined_decoration,
                   "Geometry streams can only be used in geometry shaders.",(allocator *)&xfb_stride
                  );
        CompilerError::CompilerError(pCVar14,(string *)&combined_decoration);
        __cxa_throw(pCVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((this->options).es == true) {
        pCVar14 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&combined_decoration,"Multiple geometry streams not supported in ESSL."
                   ,(allocator *)&xfb_stride);
        CompilerError::CompilerError(pCVar14,(string *)&combined_decoration);
        __cxa_throw(pCVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((this->options).version < 400) {
        ::std::__cxx11::string::string
                  ((string *)&combined_decoration,"GL_ARB_transform_feedback3",
                   (allocator *)&xfb_stride);
        require_extension_internal(this,(string *)&combined_decoration);
        ::std::__cxx11::string::~string((string *)&combined_decoration);
      }
      xfb_stride = Compiler::get_decoration
                             (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                              DecorationStream);
      join<char_const(&)[10],unsigned_int>
                ((string *)&combined_decoration,(spirv_cross *)"stream = ",
                 (char (*) [10])&xfb_stride,(uint *)pBVar18);
      goto LAB_00253b79;
    }
  }
  else {
    bVar4 = false;
  }
  if (((this_01->lower & 0x80000000) == 0) ||
     (bVar5 = can_use_io_location(this,var->storage,SUB41(local_19c,0)), !bVar5)) {
    if (bVar4) goto LAB_00253c11;
  }
  else {
    xfb_stride = Compiler::get_decoration
                           (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                            DecorationComponent);
    join<char_const(&)[13],unsigned_int>
              ((string *)&combined_decoration,(spirv_cross *)"component = ",
               (char (*) [13])&xfb_stride,(uint *)pBVar18);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&attr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &combined_decoration);
    ::std::__cxx11::string::~string((string *)&combined_decoration);
LAB_00253c11:
    if ((this->options).es != false) {
      pCVar14 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&combined_decoration,"GL_ARB_enhanced_layouts is not supported in ESSL.",
                 (allocator *)&xfb_stride);
      CompilerError::CompilerError(pCVar14,(string *)&combined_decoration);
      __cxa_throw(pCVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar1 = (this->options).version;
    uVar2 = uVar1 - 0x8c;
    pBVar18 = (Bitset *)(ulong)uVar2;
    if (uVar2 < 300) {
      ::std::__cxx11::string::string
                ((string *)&combined_decoration,"GL_ARB_enhanced_layouts",(allocator *)&xfb_stride);
      require_extension_internal(this,(string *)&combined_decoration);
      ::std::__cxx11::string::~string((string *)&combined_decoration);
      if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x1b8)) {
        ::std::__cxx11::string::string
                  ((string *)&combined_decoration,"GL_ARB_enhanced_layouts",(allocator *)&xfb_stride
                  );
        require_extension_internal(this,(string *)&combined_decoration);
        ::std::__cxx11::string::~string((string *)&combined_decoration);
      }
    }
    else if (uVar1 < 0x8c) {
      pCVar14 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&combined_decoration,
                 "GL_ARB_enhanced_layouts is not supported in targets below GLSL 1.40.",
                 (allocator *)&xfb_stride);
      CompilerError::CompilerError(pCVar14,(string *)&combined_decoration);
      __cxa_throw(pCVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  if ((this_01->lower & 0x100000000) != 0) {
    xfb_stride = Compiler::get_decoration
                           (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationIndex)
    ;
    join<char_const(&)[9],unsigned_int>
              ((string *)&combined_decoration,(spirv_cross *)0x396599,(char (*) [9])&xfb_stride,
               (uint *)pBVar18);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&attr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &combined_decoration);
    ::std::__cxx11::string::~string((string *)&combined_decoration);
  }
  SVar9 = var->storage;
  if ((((SVar9 != StorageClassPushConstant) && (SVar9 != StorageClassShaderRecordBufferKHR)) &&
      (pBVar18 = this_01, (this_01->lower & 0x400000000) != 0)) &&
     ((this->options).vulkan_semantics == true)) {
    xfb_stride = Compiler::get_decoration
                           (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                            DecorationDescriptorSet);
    join<char_const(&)[7],unsigned_int>
              ((string *)&combined_decoration,(spirv_cross *)0x397ae8,(char (*) [7])&xfb_stride,
               (uint *)pBVar18);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&attr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &combined_decoration);
    ::std::__cxx11::string::~string((string *)&combined_decoration);
    SVar9 = var->storage;
  }
  bVar4 = SVar9 == StorageClassPushConstant;
  if (SVar9 == StorageClassUniform) {
    uVar2 = (uint)local_150->lower;
    bVar15 = (byte)((uVar2 & 8) >> 3);
    bVar20 = (byte)((uVar2 & 4) >> 2);
    pBVar18 = (Bitset *)0x0;
    bVar21 = 0;
  }
  else {
    bVar15 = 1;
    if ((SVar9 != StorageClassStorageBuffer) && (SVar9 != StorageClassShaderRecordBufferKHR)) {
      bVar15 = 0;
    }
    bVar21 = SVar9 == StorageClassPushConstant &
             (this->options).emit_push_constant_as_uniform_buffer;
    pBVar18 = (Bitset *)CONCAT71((int7)((ulong)pBVar18 >> 8),1);
    bVar20 = 0;
  }
  bVar5 = (this->options).es;
  uVar2 = (this->options).version;
  if ((bVar5 & 299 < uVar2) == 0) {
    if (bVar5 != false) {
      bVar22 = 0;
      goto LAB_00253e05;
    }
    bVar22 = 0x8b < uVar2 & ~((this->options).emit_uniform_buffer_as_plain_uniforms & bVar20);
    bVar23 = 0x1a3 < uVar2 | (this->options).enable_420pack_extension;
  }
  else {
    bVar22 = (this->options).emit_uniform_buffer_as_plain_uniforms & bVar20 ^ 1;
LAB_00253e05:
    bVar23 = 0x135 < uVar2;
  }
  bVar5 = (this->options).vulkan_semantics;
  if (((SVar9 != StorageClassShaderRecordBufferKHR) &&
      (bVar16 = (byte)pBVar18 | bVar22,
      pBVar18 = (Bitset *)CONCAT71((int7)((ulong)pBVar18 >> 8),bVar16), bVar16 != 0)) &&
     ((bVar23 != 0 && (pBVar18 = this_01, (this_01->lower & 0x200000000) != 0)))) {
    xfb_stride = Compiler::get_decoration
                           (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                            DecorationBinding);
    join<char_const(&)[11],unsigned_int>
              ((string *)&combined_decoration,(spirv_cross *)"binding = ",(char (*) [11])&xfb_stride
               ,(uint *)pBVar18);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&attr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &combined_decoration);
    ::std::__cxx11::string::~string((string *)&combined_decoration);
    SVar9 = var->storage;
  }
  if ((SVar9 != StorageClassOutput) && ((this_01->lower & 0x800000000) != 0)) {
    xfb_stride = Compiler::get_decoration
                           (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationOffset
                           );
    join<char_const(&)[10],unsigned_int>
              ((string *)&combined_decoration,(spirv_cross *)0x397ae5,(char (*) [10])&xfb_stride,
               (uint *)pBVar18);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&attr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &combined_decoration);
    ::std::__cxx11::string::~string((string *)&combined_decoration);
  }
  this_00 = local_158;
  if (bVar22 != 0) {
    if (bVar20 == 0 && bVar21 == 0) {
      if ((byte)(bVar4 & bVar5 | bVar15) != 1) goto LAB_00253f85;
      buffer_to_packing_standard_abi_cxx11_((string *)&combined_decoration,this,local_1a8,true);
    }
    else {
      buffer_to_packing_standard_abi_cxx11_((string *)&combined_decoration,this,local_1a8,false);
    }
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&attr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &combined_decoration);
    ::std::__cxx11::string::~string((string *)&combined_decoration);
  }
LAB_00253f85:
  if (((*(int *)&(local_1a8->super_IVariant).field_0xc == 0x10) && ((local_1a8->image).sampled == 2)
      ) && (pcVar13 = format_to_glsl(this,(local_1a8->image).format), pcVar13 != (char *)0x0)) {
    ::std::__cxx11::string::string((string *)&combined_decoration,pcVar13,(allocator *)&xfb_stride);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&attr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &combined_decoration);
    ::std::__cxx11::string::~string((string *)&combined_decoration);
  }
  if (attr.
      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .buffer_size == 0) {
    ::std::__cxx11::string::string((string *)this_00,"",(allocator *)&combined_decoration);
  }
  else {
    ::std::__cxx11::string::string((string *)this_00,"layout(",(allocator *)&combined_decoration);
    merge((string *)&combined_decoration,&attr,", ");
    ::std::__cxx11::string::append((string *)this_00);
    ::std::__cxx11::string::~string((string *)&combined_decoration);
    ::std::__cxx11::string::append((char *)this_00);
  }
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector(&attr);
  return this_00;
}

Assistant:

string CompilerGLSL::layout_for_variable(const SPIRVariable &var)
{
	// FIXME: Come up with a better solution for when to disable layouts.
	// Having layouts depend on extensions as well as which types
	// of layouts are used. For now, the simple solution is to just disable
	// layouts for legacy versions.
	if (is_legacy())
		return "";

	if (subpass_input_is_framebuffer_fetch(var.self))
		return "";

	SmallVector<string> attr;

	auto &type = get<SPIRType>(var.basetype);
	auto &flags = get_decoration_bitset(var.self);
	auto &typeflags = get_decoration_bitset(type.self);

	if (flags.get(DecorationPassthroughNV))
		attr.push_back("passthrough");

	if (options.vulkan_semantics && var.storage == StorageClassPushConstant)
		attr.push_back("push_constant");
	else if (var.storage == StorageClassShaderRecordBufferKHR)
		attr.push_back(ray_tracing_is_khr ? "shaderRecordEXT" : "shaderRecordNV");

	if (flags.get(DecorationRowMajor))
		attr.push_back("row_major");
	if (flags.get(DecorationColMajor))
		attr.push_back("column_major");

	if (options.vulkan_semantics)
	{
		if (flags.get(DecorationInputAttachmentIndex))
			attr.push_back(join("input_attachment_index = ", get_decoration(var.self, DecorationInputAttachmentIndex)));
	}

	bool is_block = has_decoration(type.self, DecorationBlock);
	if (flags.get(DecorationLocation) && can_use_io_location(var.storage, is_block))
	{
		Bitset combined_decoration;
		for (uint32_t i = 0; i < ir.meta[type.self].members.size(); i++)
			combined_decoration.merge_or(combined_decoration_for_member(type, i));

		// If our members have location decorations, we don't need to
		// emit location decorations at the top as well (looks weird).
		if (!combined_decoration.get(DecorationLocation))
			attr.push_back(join("location = ", get_decoration(var.self, DecorationLocation)));
	}

	if (get_execution_model() == ExecutionModelFragment && var.storage == StorageClassOutput &&
	    location_is_non_coherent_framebuffer_fetch(get_decoration(var.self, DecorationLocation)))
	{
		attr.push_back("noncoherent");
	}

	// Transform feedback
	bool uses_enhanced_layouts = false;
	if (is_block && var.storage == StorageClassOutput)
	{
		// For blocks, there is a restriction where xfb_stride/xfb_buffer must only be declared on the block itself,
		// since all members must match the same xfb_buffer. The only thing we will declare for members of the block
		// is the xfb_offset.
		uint32_t member_count = uint32_t(type.member_types.size());
		bool have_xfb_buffer_stride = false;
		bool have_any_xfb_offset = false;
		bool have_geom_stream = false;
		uint32_t xfb_stride = 0, xfb_buffer = 0, geom_stream = 0;

		if (flags.get(DecorationXfbBuffer) && flags.get(DecorationXfbStride))
		{
			have_xfb_buffer_stride = true;
			xfb_buffer = get_decoration(var.self, DecorationXfbBuffer);
			xfb_stride = get_decoration(var.self, DecorationXfbStride);
		}

		if (flags.get(DecorationStream))
		{
			have_geom_stream = true;
			geom_stream = get_decoration(var.self, DecorationStream);
		}

		// Verify that none of the members violate our assumption.
		for (uint32_t i = 0; i < member_count; i++)
		{
			if (has_member_decoration(type.self, i, DecorationStream))
			{
				uint32_t member_geom_stream = get_member_decoration(type.self, i, DecorationStream);
				if (have_geom_stream && member_geom_stream != geom_stream)
					SPIRV_CROSS_THROW("IO block member Stream mismatch.");
				have_geom_stream = true;
				geom_stream = member_geom_stream;
			}

			// Only members with an Offset decoration participate in XFB.
			if (!has_member_decoration(type.self, i, DecorationOffset))
				continue;
			have_any_xfb_offset = true;

			if (has_member_decoration(type.self, i, DecorationXfbBuffer))
			{
				uint32_t buffer_index = get_member_decoration(type.self, i, DecorationXfbBuffer);
				if (have_xfb_buffer_stride && buffer_index != xfb_buffer)
					SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
				have_xfb_buffer_stride = true;
				xfb_buffer = buffer_index;
			}

			if (has_member_decoration(type.self, i, DecorationXfbStride))
			{
				uint32_t stride = get_member_decoration(type.self, i, DecorationXfbStride);
				if (have_xfb_buffer_stride && stride != xfb_stride)
					SPIRV_CROSS_THROW("IO block member XfbStride mismatch.");
				have_xfb_buffer_stride = true;
				xfb_stride = stride;
			}
		}

		if (have_xfb_buffer_stride && have_any_xfb_offset)
		{
			attr.push_back(join("xfb_buffer = ", xfb_buffer));
			attr.push_back(join("xfb_stride = ", xfb_stride));
			uses_enhanced_layouts = true;
		}

		if (have_geom_stream)
		{
			if (get_execution_model() != ExecutionModelGeometry)
				SPIRV_CROSS_THROW("Geometry streams can only be used in geometry shaders.");
			if (options.es)
				SPIRV_CROSS_THROW("Multiple geometry streams not supported in ESSL.");
			if (options.version < 400)
				require_extension_internal("GL_ARB_transform_feedback3");
			attr.push_back(join("stream = ", get_decoration(var.self, DecorationStream)));
		}
	}
	else if (var.storage == StorageClassOutput)
	{
		if (flags.get(DecorationXfbBuffer) && flags.get(DecorationXfbStride) && flags.get(DecorationOffset))
		{
			// XFB for standalone variables, we can emit all decorations.
			attr.push_back(join("xfb_buffer = ", get_decoration(var.self, DecorationXfbBuffer)));
			attr.push_back(join("xfb_stride = ", get_decoration(var.self, DecorationXfbStride)));
			attr.push_back(join("xfb_offset = ", get_decoration(var.self, DecorationOffset)));
			uses_enhanced_layouts = true;
		}

		if (flags.get(DecorationStream))
		{
			if (get_execution_model() != ExecutionModelGeometry)
				SPIRV_CROSS_THROW("Geometry streams can only be used in geometry shaders.");
			if (options.es)
				SPIRV_CROSS_THROW("Multiple geometry streams not supported in ESSL.");
			if (options.version < 400)
				require_extension_internal("GL_ARB_transform_feedback3");
			attr.push_back(join("stream = ", get_decoration(var.self, DecorationStream)));
		}
	}

	// Can only declare Component if we can declare location.
	if (flags.get(DecorationComponent) && can_use_io_location(var.storage, is_block))
	{
		uses_enhanced_layouts = true;
		attr.push_back(join("component = ", get_decoration(var.self, DecorationComponent)));
	}

	if (uses_enhanced_layouts)
	{
		if (!options.es)
		{
			if (options.version < 440 && options.version >= 140)
				require_extension_internal("GL_ARB_enhanced_layouts");
			else if (options.version < 140)
				SPIRV_CROSS_THROW("GL_ARB_enhanced_layouts is not supported in targets below GLSL 1.40.");
			if (!options.es && options.version < 440)
				require_extension_internal("GL_ARB_enhanced_layouts");
		}
		else if (options.es)
			SPIRV_CROSS_THROW("GL_ARB_enhanced_layouts is not supported in ESSL.");
	}

	if (flags.get(DecorationIndex))
		attr.push_back(join("index = ", get_decoration(var.self, DecorationIndex)));

	// Do not emit set = decoration in regular GLSL output, but
	// we need to preserve it in Vulkan GLSL mode.
	if (var.storage != StorageClassPushConstant && var.storage != StorageClassShaderRecordBufferKHR)
	{
		if (flags.get(DecorationDescriptorSet) && options.vulkan_semantics)
			attr.push_back(join("set = ", get_decoration(var.self, DecorationDescriptorSet)));
	}

	bool push_constant_block = options.vulkan_semantics && var.storage == StorageClassPushConstant;
	bool ssbo_block = var.storage == StorageClassStorageBuffer || var.storage == StorageClassShaderRecordBufferKHR ||
	                  (var.storage == StorageClassUniform && typeflags.get(DecorationBufferBlock));
	bool emulated_ubo = var.storage == StorageClassPushConstant && options.emit_push_constant_as_uniform_buffer;
	bool ubo_block = var.storage == StorageClassUniform && typeflags.get(DecorationBlock);

	// GL 3.0/GLSL 1.30 is not considered legacy, but it doesn't have UBOs ...
	bool can_use_buffer_blocks = (options.es && options.version >= 300) || (!options.es && options.version >= 140);

	// pretend no UBOs when options say so
	if (ubo_block && options.emit_uniform_buffer_as_plain_uniforms)
		can_use_buffer_blocks = false;

	bool can_use_binding;
	if (options.es)
		can_use_binding = options.version >= 310;
	else
		can_use_binding = options.enable_420pack_extension || (options.version >= 420);

	// Make sure we don't emit binding layout for a classic uniform on GLSL 1.30.
	if (!can_use_buffer_blocks && var.storage == StorageClassUniform)
		can_use_binding = false;

	if (var.storage == StorageClassShaderRecordBufferKHR)
		can_use_binding = false;

	if (can_use_binding && flags.get(DecorationBinding))
		attr.push_back(join("binding = ", get_decoration(var.self, DecorationBinding)));

	if (var.storage != StorageClassOutput && flags.get(DecorationOffset))
		attr.push_back(join("offset = ", get_decoration(var.self, DecorationOffset)));

	// Instead of adding explicit offsets for every element here, just assume we're using std140 or std430.
	// If SPIR-V does not comply with either layout, we cannot really work around it.
	if (can_use_buffer_blocks && (ubo_block || emulated_ubo))
	{
		attr.push_back(buffer_to_packing_standard(type, false));
	}
	else if (can_use_buffer_blocks && (push_constant_block || ssbo_block))
	{
		attr.push_back(buffer_to_packing_standard(type, true));
	}

	// For images, the type itself adds a layout qualifer.
	// Only emit the format for storage images.
	if (type.basetype == SPIRType::Image && type.image.sampled == 2)
	{
		const char *fmt = format_to_glsl(type.image.format);
		if (fmt)
			attr.push_back(fmt);
	}

	if (attr.empty())
		return "";

	string res = "layout(";
	res += merge(attr);
	res += ") ";
	return res;
}